

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O0

void __thiscall OpenMD::SequentialAnalyzer::doSequence(SequentialAnalyzer *this)

{
  undefined1 uVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  SelectionEvaluator *in_RDI;
  int nFrames;
  DumpReader reader;
  pointer *in_stack_ffffffffffffecf8;
  undefined7 in_stack_ffffffffffffed00;
  undefined1 in_stack_ffffffffffffed07;
  SelectionSet *in_stack_ffffffffffffed08;
  undefined7 in_stack_ffffffffffffed10;
  int in_stack_ffffffffffffed8c;
  DumpReader *in_stack_ffffffffffffed90;
  string *in_stack_ffffffffffffef50;
  SimInfo *in_stack_ffffffffffffef58;
  DumpReader *in_stack_ffffffffffffef60;
  
  (**(code **)(*(long *)&(in_RDI->compiler).filename + 0x18))();
  DumpReader::DumpReader
            (in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  iVar2 = DumpReader::getNFrames
                    ((DumpReader *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
  *(undefined4 *)
   &in_RDI[2].nameFinder.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = 0;
  while (*(int *)&in_RDI[2].nameFinder.root_.
                  super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr < iVar2) {
    DumpReader::readFrame(in_stack_ffffffffffffed90,in_stack_ffffffffffffed8c);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)(in_RDI->compiler).filename._M_string_length);
    pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
    (in_RDI->compiler).filename.field_2._M_allocated_capacity = (size_type)pSVar3;
    Snapshot::getTime((Snapshot *)(in_RDI->compiler).filename.field_2._M_allocated_capacity);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00),
               (value_type_conflict *)in_stack_ffffffffffffecf8);
    uVar1 = SelectionEvaluator::isDynamic
                      ((SelectionEvaluator *)
                       &(in_RDI->compiler).atokenInfix.
                        super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    if ((bool)uVar1) {
      in_stack_ffffffffffffed08 = (SelectionSet *)((long)&(in_RDI->compiler).script.field_2 + 8);
      SelectionEvaluator::evaluate(in_RDI);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffed10),
                 in_stack_ffffffffffffed08);
      SelectionSet::~SelectionSet((SelectionSet *)0x13e4e7);
    }
    in_stack_ffffffffffffed07 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI[1].info)
    ;
    if ((bool)in_stack_ffffffffffffed07) {
      in_stack_ffffffffffffecf8 =
           &in_RDI[1].compiler.atokenInfix.
            super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
            super__Vector_impl_data._M_finish;
      SelectionEvaluator::evaluate(in_RDI);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffed10),
                 in_stack_ffffffffffffed08);
      SelectionSet::~SelectionSet((SelectionSet *)0x13e585);
    }
    (**(code **)(*(long *)&(in_RDI->compiler).filename + 0x30))
              (in_RDI,*(undefined4 *)
                       &in_RDI[2].nameFinder.root_.
                        super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    *(int *)&in_RDI[2].nameFinder.root_.
             super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&in_RDI[2].info +
         *(int *)&in_RDI[2].nameFinder.root_.
                  super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(*(long *)&(in_RDI->compiler).filename + 0x20))();
  (**(code **)(*(long *)&(in_RDI->compiler).filename + 0x28))();
  DumpReader::~DumpReader
            ((DumpReader *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
  return;
}

Assistant:

void SequentialAnalyzer::doSequence() {
    preSequence();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    // storageLayout_ = info_->getStorageLayout();

    for (frame_ = 0; frame_ < nFrames; frame_ += step_) {
      reader.readFrame(frame_);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      times_.push_back(currentSnapshot_->getTime());

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      doFrame(frame_);
    }

    postSequence();
    writeSequence();
  }